

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

void rotating_example(void)

{
  shared_ptr<spdlog::logger> rotating_logger;
  file_event_handlers *this;
  undefined1 in_stack_ffffffffffffff4f;
  size_t in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  filename_t *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  file_event_handlers *in_stack_ffffffffffffff80;
  undefined1 local_69 [56];
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"some_logger_name",&local_31);
  this = (file_event_handlers *)local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_69 + 1),"logs/rotating.txt",(allocator *)this);
  spdlog::file_event_handlers::file_event_handlers(this);
  spdlog::rotating_logger_mt<spdlog::synchronous_factory>
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff50,(bool)in_stack_ffffffffffffff4f,in_stack_ffffffffffffff80);
  spdlog::file_event_handlers::~file_event_handlers(this);
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x10d540);
  return;
}

Assistant:

void rotating_example() {
    // Create a file rotating logger with 5mb size max and 3 rotated files.
    auto rotating_logger =
        spdlog::rotating_logger_mt("some_logger_name", "logs/rotating.txt", 1048576 * 5, 3);
}